

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_projection.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownProjection
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  FilterResult FVar6;
  pointer pLVar7;
  LogicalProjection *proj;
  type pFVar8;
  pointer pEVar9;
  reference pvVar10;
  ClientContext *in_RDX;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var11;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  remain_expressions;
  FilterPushdown child_pushdown;
  undefined1 local_1c0 [48];
  LogicalOperator *local_190;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_188;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_170
  ;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_168;
  FilterPushdown local_150;
  
  local_1c0._8_8_ = in_RDX;
  local_1c0._32_8_ = this;
  pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)in_RDX);
  proj = LogicalOperator::Cast<duckdb::LogicalProjection>(pLVar7);
  FilterPushdown(&local_150,
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var11._M_head_impl =
       op[0x21].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  _Var1._M_head_impl =
       op[0x22].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_170 = op;
  do {
    if (_Var11._M_head_impl == _Var1._M_head_impl) {
      GenerateFilters(&local_150);
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1c0._8_8_);
      pvVar10 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar7->children,0);
      local_190 = (pvVar10->
                  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                  .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar10->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0
      ;
      Rewrite((FilterPushdown *)local_1c0,
              (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)&local_150);
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1c0._8_8_);
      pvVar10 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar7->children,0);
      uVar3 = local_1c0._0_8_;
      local_1c0._0_8_ = (Optimizer *)0x0;
      _Var11._M_head_impl =
           (pvVar10->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      (pvVar10->
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t
      .super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
           (LogicalOperator *)uVar3;
      if (_Var11._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)((long)(_Var11._M_head_impl)->_vptr_LogicalOperator + 8))();
      }
      if ((Optimizer *)local_1c0._0_8_ != (Optimizer *)0x0) {
        (*(code *)((*(ClientContext **)local_1c0._0_8_)->
                  super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)();
      }
      local_1c0._0_8_ = (LogicalOperator *)0x0;
      if (local_190 != (LogicalOperator *)0x0) {
        (*local_190->_vptr_LogicalOperator[1])();
      }
      local_190 = (LogicalOperator *)0x0;
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)local_1c0._8_8_);
      pvVar10 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&pLVar7->children,0);
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar10);
      if (pLVar7->type == LOGICAL_EMPTY_RESULT) {
        make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((duckdb *)local_1c0,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_1c0._8_8_);
LAB_01239398:
        *(_func_int ***)local_1c0._32_8_ = (_func_int **)local_1c0._0_8_;
      }
      else {
        local_1c0._40_8_ =
             (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                *)&(((enable_shared_from_this<duckdb::ClientContext> *)local_1c0._8_8_)->
                   __weak_this_).internal.
                   super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl;
        (((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           *)&(((enable_shared_from_this<duckdb::ClientContext> *)local_1c0._8_8_)->__weak_this_).
              internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>)._M_head_impl =
             (LogicalOperator *)0x0;
        local_168.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_188.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_168.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_188.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_168.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_188.
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_188.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_188.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_188.
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        AddLogicalFilter((FilterPushdown *)local_1c0._32_8_,local_170,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)(local_1c0 + 0x28));
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::~vector(&local_168);
        if ((LogicalOperator *)local_1c0._40_8_ != (LogicalOperator *)0x0) {
          (*(*(_func_int ***)local_1c0._40_8_)[1])();
        }
        local_1c0._40_8_ = (__buckets_ptr)0x0;
      }
      uVar3 = local_1c0._32_8_;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector(&local_188);
      ~FilterPushdown(&local_150);
      return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
             (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              )uVar3;
    }
    pFVar8 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
             ::operator*((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                          *)_Var11._M_head_impl);
    expr = &pFVar8->filter;
    bVar4 = IsVolatile(proj,expr);
    if (bVar4) {
LAB_0123918a:
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_188,expr);
    }
    else {
      pEVar9 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(expr);
      iVar5 = (*(pEVar9->super_BaseExpression)._vptr_BaseExpression[0x10])(pEVar9);
      if ((char)iVar5 != '\0') goto LAB_0123918a;
      local_1c0._24_8_ =
           (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      ReplaceProjectionBindings
                ((duckdb *)local_1c0,proj,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 (local_1c0 + 0x18));
      uVar3 = local_1c0._0_8_;
      local_1c0._0_8_ = (Optimizer *)0x0;
      _Var2._M_head_impl =
           (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
      if (_Var2._M_head_impl != (Expression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
        if ((Optimizer *)local_1c0._0_8_ != (Optimizer *)0x0) {
          (*(code *)((*(ClientContext **)local_1c0._0_8_)->
                    super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                    super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)();
        }
      }
      local_1c0._0_8_ = (LogicalOperator *)0x0;
      if ((Expression *)local_1c0._24_8_ != (Expression *)0x0) {
        (*((BaseExpression *)local_1c0._24_8_)->_vptr_BaseExpression[1])();
      }
      local_1c0._24_8_ = (pointer)0x0;
      local_1c0._16_8_ =
           (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
           _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      (expr->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
      FVar6 = AddFilter(&local_150,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)(local_1c0 + 0x10));
      if ((Expression *)local_1c0._16_8_ != (Expression *)0x0) {
        (**(code **)((long)((BaseExpression *)local_1c0._16_8_)->_vptr_BaseExpression + 8))();
      }
      local_1c0._16_8_ = (pointer)0x0;
      if (FVar6 == UNSATISFIABLE) {
        make_uniq<duckdb::LogicalEmptyResult,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                  ((duckdb *)local_1c0,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)local_1c0._8_8_);
        goto LAB_01239398;
      }
    }
    _Var11._M_head_impl = (LogicalOperator *)&(_Var11._M_head_impl)->type;
  } while( true );
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownProjection(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_PROJECTION);
	auto &proj = op->Cast<LogicalProjection>();
	// push filter through logical projection
	// all the BoundColumnRefExpressions in the filter should refer to the LogicalProjection
	// we can rewrite them by replacing those references with the expression of the LogicalProjection node
	FilterPushdown child_pushdown(optimizer, convert_mark_joins);
	// There are some expressions can not be pushed down. We should keep them
	// and add an extra filter operator.
	vector<unique_ptr<Expression>> remain_expressions;
	for (auto &filter : filters) {
		auto &f = *filter;
		D_ASSERT(f.bindings.size() <= 1);
		bool is_volatile = IsVolatile(proj, f.filter);
		if (is_volatile || f.filter->CanThrow()) {
			// We can't push down related expressions if the column in the
			// expression is generated by the functions which have side effects
			remain_expressions.push_back(std::move(f.filter));
		} else {
			// rewrite the bindings within this subquery
			f.filter = ReplaceProjectionBindings(proj, std::move(f.filter));
			// add the filter to the child pushdown
			if (child_pushdown.AddFilter(std::move(f.filter)) == FilterResult::UNSATISFIABLE) {
				// filter statically evaluates to false, strip tree
				return make_uniq<LogicalEmptyResult>(std::move(op));
			}
		}
	}
	child_pushdown.GenerateFilters();
	// now push into children
	op->children[0] = child_pushdown.Rewrite(std::move(op->children[0]));
	if (op->children[0]->type == LogicalOperatorType::LOGICAL_EMPTY_RESULT) {
		// child returns an empty result: generate an empty result here too
		return make_uniq<LogicalEmptyResult>(std::move(op));
	}
	return AddLogicalFilter(std::move(op), std::move(remain_expressions));
}